

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O3

string * __thiscall
cfd::core::ExtPrivkey::ToString_abi_cxx11_(string *__return_storage_ptr__,ExtPrivkey *this)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ExtPrivkey","");
  ToBase58String(__return_storage_ptr__,&this->serialize_data_,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ExtPrivkey::ToString() const {
  return ToBase58String(serialize_data_, "ExtPrivkey");
}